

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinyexr.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  uint uVar1;
  ostream *poVar2;
  char *err;
  int height;
  int width;
  float *image;
  
  err = (char *)0x0;
  if (argc < 2) {
    fwrite("Needs input.exr.\n",0x11,1,_stderr);
  }
  else {
    filename = argv[1];
    uVar1 = IsEXR(filename);
    if (uVar1 == 0) {
      uVar1 = LoadEXR(&image,&width,&height,filename,&err);
      if (uVar1 == 0) {
        uVar1 = SaveEXR(image,width,height,4,1,"output.exr",&err);
        if (uVar1 != 0) {
          if (err == (char *)0x0) {
            fprintf(_stderr,"Failed to save EXR image. code = %d\n",(ulong)uVar1);
          }
          else {
            fprintf(_stderr,"Save EXR err: %s(code %d)\n",err,(ulong)uVar1);
          }
        }
        free(image);
        poVar2 = std::operator<<((ostream *)&std::cout,"Wrote output.exr.");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      else {
        if (err == (char *)0x0) {
          fprintf(_stderr,"Load EXR err: code = %d\n",(ulong)uVar1);
        }
        else {
          fprintf(_stderr,"Load EXR err: %s(code %d)\n",err,(ulong)uVar1);
        }
        free(err);
      }
      return uVar1;
    }
    fprintf(_stderr,"File not found or given file is not a EXR format. code %d\n",(ulong)uVar1);
  }
  exit(-1);
}

Assistant:

int test_main(int argc, char** argv) {
  const char* outfilename = "output_test.exr";
  const char* err = NULL;

  if (argc < 2) {
    fprintf(stderr, "Needs input.exr.\n");
    exit(-1);
  }

  if (argc > 2) {
    outfilename = argv[2];
  }

  const char* input_filename = argv[1];

#ifdef SIMPLE_API_EXAMPLE
  (void)outfilename;
  int width, height;
  float* image;

  int ret = IsEXR(input_filename);
  if (ret != TINYEXR_SUCCESS) {
    fprintf(stderr, "File not found or given file is not a EXR format. code %d\n", ret);
    exit(-1);
  }

  ret = LoadEXR(&image, &width, &height, input_filename, &err);
  if (ret != TINYEXR_SUCCESS) {
    if (err) {
      fprintf(stderr, "Load EXR err: %s(code %d)\n", err, ret);
    } else {
      fprintf(stderr, "Load EXR err: code = %d\n", ret);
    }
    FreeEXRErrorMessage(err);
    return ret;
  }

  // SaveAsPFM("output.pfm", width, height, image);
  ret = SaveEXR(image, width, height, 4 /* =RGBA*/,
                1 /* = save as fp16 format */, "output.exr", &err);
  if (ret != TINYEXR_SUCCESS) {
    if (err) {
      fprintf(stderr, "Save EXR err: %s(code %d)\n", err, ret);
    } else {
      fprintf(stderr, "Failed to save EXR image. code = %d\n", ret);
    }
  }
  free(image);

  std::cout << "Wrote output.exr." << std::endl;
#else

  EXRVersion exr_version;

  int ret = ParseEXRVersionFromFile(&exr_version, input_filename);
  if (ret != 0) {
    fprintf(stderr, "Invalid EXR file: %s\n", input_filename);
    return -1;
  }

  printf(
      "version: tiled = %d, long_name = %d, non_image = %d, multipart = %d\n",
      exr_version.tiled, exr_version.long_name, exr_version.non_image,
      exr_version.multipart);

  if (exr_version.multipart) {
    EXRHeader** exr_headers;  // list of EXRHeader pointers.
    int num_exr_headers;

    ret = ParseEXRMultipartHeaderFromFile(&exr_headers, &num_exr_headers,
                                          &exr_version, argv[1], &err);
    if (ret != 0) {
      fprintf(stderr, "Parse EXR err: %s\n", err);
      return ret;
    }

    printf("num parts = %d\n", num_exr_headers);

    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      const EXRHeader& exr_header = *(exr_headers[i]);

      printf("Part: %lu\n", static_cast<unsigned long>(i));

      printf("dataWindow = %d, %d, %d, %d\n", exr_header.data_window.min_x,
             exr_header.data_window.min_y, exr_header.data_window.max_x,
             exr_header.data_window.max_y);
      printf("displayWindow = %d, %d, %d, %d\n", exr_header.display_window.min_x,
             exr_header.display_window.min_y, exr_header.display_window.max_x,
             exr_header.display_window.max_y);
      printf("screenWindowCenter = %f, %f\n",
             static_cast<double>(exr_header.screen_window_center[0]),
             static_cast<double>(exr_header.screen_window_center[1]));
      printf("screenWindowWidth = %f\n",
             static_cast<double>(exr_header.screen_window_width));
      printf("pixelAspectRatio = %f\n",
             static_cast<double>(exr_header.pixel_aspect_ratio));
      printf("lineOrder = %d\n", exr_header.line_order);

      if (exr_header.num_custom_attributes > 0) {
        printf("# of custom attributes = %d\n",
               exr_header.num_custom_attributes);
        for (int a = 0; a < exr_header.num_custom_attributes; a++) {
          printf("  [%d] name = %s, type = %s, size = %d\n", a,
                 exr_header.custom_attributes[a].name,
                 exr_header.custom_attributes[a].type,
                 exr_header.custom_attributes[a].size);
          // if (strcmp(exr_header.custom_attributes[i].type, "float") == 0) {
          //  printf("    value = %f\n", *reinterpret_cast<float
          //  *>(exr_header.custom_attributes[i].value));
          //}
        }
      }
    }

    std::vector<EXRImage> images(static_cast<size_t>(num_exr_headers));
    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      InitEXRImage(&images[i]);
    }

    ret = LoadEXRMultipartImageFromFile(
        &images.at(0), const_cast<const EXRHeader**>(exr_headers),
        static_cast<unsigned int>(num_exr_headers), input_filename, &err);
    if (ret != 0) {
      fprintf(stderr, "Load EXR err: %s\n", err);
      FreeEXRErrorMessage(err);
      return ret;
    }

    printf("Loaded %d part images\n", num_exr_headers);
    printf(
        "There is no saving feature for multi-part images, thus just exit an "
        "application...\n");

    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      FreeEXRImage(&images.at(i));
    }

    for (size_t i = 0; i < static_cast<size_t>(num_exr_headers); i++) {
      FreeEXRHeader(exr_headers[i]);
      free(exr_headers[i]);
    }
    free(exr_headers);

  } else {  // single-part EXR

    EXRHeader exr_header;
    InitEXRHeader(&exr_header);

    ret =
        ParseEXRHeaderFromFile(&exr_header, &exr_version, input_filename, &err);
    if (ret != 0) {
      fprintf(stderr, "Parse single-part EXR err: %s\n", err);
      FreeEXRErrorMessage(err);
      return ret;
    }

    printf("dataWindow = %d, %d, %d, %d\n", exr_header.data_window.min_x,
           exr_header.data_window.min_y, exr_header.data_window.max_x,
           exr_header.data_window.max_y);
    printf("displayWindow = %d, %d, %d, %d\n", exr_header.display_window.min_x,
           exr_header.display_window.min_y, exr_header.display_window.max_x,
           exr_header.display_window.max_y);
    printf("screenWindowCenter = %f, %f\n",
           static_cast<double>(exr_header.screen_window_center[0]),
           static_cast<double>(exr_header.screen_window_center[1]));
    printf("screenWindowWidth = %f\n",
           static_cast<double>(exr_header.screen_window_width));
    printf("pixelAspectRatio = %f\n",
           static_cast<double>(exr_header.pixel_aspect_ratio));
    printf("lineOrder = %d\n", exr_header.line_order);

    if (exr_header.num_custom_attributes > 0) {
      printf("# of custom attributes = %d\n", exr_header.num_custom_attributes);
      for (int i = 0; i < exr_header.num_custom_attributes; i++) {
        printf("  [%d] name = %s, type = %s, size = %d\n", i,
               exr_header.custom_attributes[i].name,
               exr_header.custom_attributes[i].type,
               exr_header.custom_attributes[i].size);
        // if (strcmp(exr_header.custom_attributes[i].type, "float") == 0) {
        //  printf("    value = %f\n", *reinterpret_cast<float
        //  *>(exr_header.custom_attributes[i].value));
        //}
      }
    }

    // Read HALF channel as FLOAT.
    for (int i = 0; i < exr_header.num_channels; i++) {
      if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
        exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
      }
    }

    EXRImage exr_image;
    InitEXRImage(&exr_image);

    ret = LoadEXRImageFromFile(&exr_image, &exr_header, input_filename, &err);
    if (ret != 0) {
      fprintf(stderr, "Load EXR err: %s\n", err);
      FreeEXRHeader(&exr_header);
      FreeEXRErrorMessage(err);
      return ret;
    }

    printf("EXR: %d x %d\n", exr_image.width, exr_image.height);

    for (int i = 0; i < exr_header.num_channels; i++) {
      printf("pixelType[%d]: %s\n", i, GetPixelType(exr_header.pixel_types[i]));
      printf("chan[%d] = %s\n", i, exr_header.channels[i].name);
      printf("requestedPixelType[%d]: %s\n", i,
             GetPixelType(exr_header.requested_pixel_types[i]));
    }

#if 0  // example to write custom attribute
    int version_minor = 3;
    exr_header.num_custom_attributes = 1;
    exr_header.custom_attributes = reinterpret_cast<EXRAttribute *>(malloc(sizeof(EXRAttribute) * exr_header.custom_attributes));
    strcpy(exr_header.custom_attributes[0].name, "tinyexr_version_minor");
    exr_header.custom_attributes[0].name[strlen("tinyexr_version_minor")] = '\0';
    strcpy(exr_header.custom_attributes[0].type, "int");
    exr_header.custom_attributes[0].type[strlen("int")] = '\0';
    exr_header.custom_attributes[0].size = sizeof(int);
    exr_header.custom_attributes[0].value = (unsigned char*)malloc(sizeof(int));
    memcpy(exr_header.custom_attributes[0].value, &version_minor, sizeof(int));
#endif

    if (exr_header.tiled) {
      TiledImageToScanlineImage(&exr_image, &exr_header);
    }

    exr_header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;

#ifdef TEST_ZFP_COMPRESSION
    // Assume input image is FLOAT pixel type.
    for (int i = 0; i < exr_header.num_channels; i++) {
      exr_header.channels[i].pixel_type = TINYEXR_PIXELTYPE_FLOAT;
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }

    unsigned char zfp_compression_type = TINYEXR_ZFP_COMPRESSIONTYPE_RATE;
    double zfp_compression_rate = 4;
    exr_header.num_custom_attributes = 2;
    strcpy(exr_header.custom_attributes[0].name, "zfpCompressionType");
    exr_header.custom_attributes[0].name[strlen("zfpCompressionType")] = '\0';
    exr_header.custom_attributes[0].size = 1;
    exr_header.custom_attributes[0].value =
        (unsigned char*)malloc(sizeof(unsigned char));
    exr_header.custom_attributes[0].value[0] = zfp_compression_type;

    strcpy(exr_header.custom_attributes[1].name, "zfpCompressionRate");
    exr_header.custom_attributes[1].name[strlen("zfpCompressionRate")] = '\0';
    exr_header.custom_attributes[1].size = sizeof(double);
    exr_header.custom_attributes[1].value =
        (unsigned char*)malloc(sizeof(double));
    memcpy(exr_header.custom_attributes[1].value, &zfp_compression_rate,
           sizeof(double));
    exr_header.compression_type = TINYEXR_COMPRESSIONTYPE_ZFP;
#endif

    ret = SaveEXRImageToFile(&exr_image, &exr_header, outfilename, &err);
    if (ret != 0) {
      fprintf(stderr, "Save EXR err: %s\n", err);
      FreeEXRHeader(&exr_header);
      FreeEXRErrorMessage(err);
      return ret;
    }
    printf("Saved exr file. [ %s ] \n", outfilename);

    FreeEXRHeader(&exr_header);
    FreeEXRImage(&exr_image);
  }
#endif

  return ret;
}